

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable *table)

{
  int iVar1;
  ImGuiTableColumn *pIVar2;
  long lVar3;
  
  iVar1 = table->ColumnsCount;
  if (0 < (long)iVar1) {
    pIVar2 = (table->Columns).Data;
    lVar3 = 0;
    do {
      if (((&pIVar2->IsEnabled)[lVar3] != false) ||
         ((*(byte *)((long)&pIVar2->Flags + lVar3) & 8) != 0)) {
        *(undefined2 *)(&pIVar2->AutoFitQueue + lVar3) = 0x102;
      }
      lVar3 = lVar3 + 0x70;
    } while ((long)iVar1 * 0x70 - lVar3 != 0);
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable* table)
{
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_WidthStretch)) // Cannot reset weight of hidden stretch column
            continue;
        column->CannotSkipItemsQueue = (1 << 0);
        column->AutoFitQueue = (1 << 1);
    }
}